

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O2

AppendResult __thiscall
metaf::WindGroup::appendPeakWind(WindGroup *this,string *group,ReportMetadata *reportMetadata)

{
  size_type sVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  AppendResult AVar6;
  optional<metaf::Direction> oVar7;
  optional<metaf::Speed> oVar8;
  string_type sStack_88;
  smatch match;
  string_type local_48;
  unsigned_long uVar5;
  
  if (appendPeakWind(std::__cxx11::string_const&,metaf::ReportMetadata_const&)::pkWndRgx_abi_cxx11_
      == '\0') {
    iVar4 = __cxa_guard_acquire(&appendPeakWind(std::__cxx11::string_const&,metaf::ReportMetadata_const&)
                                 ::pkWndRgx_abi_cxx11_);
    if (iVar4 != 0) {
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                (&appendPeakWind(std::__cxx11::string_const&,metaf::ReportMetadata_const&)::
                  pkWndRgx_abi_cxx11_,"(\\d\\d0)([1-9]?\\d\\d)/(\\d\\d)?(\\d\\d)",0x10);
      __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                   &appendPeakWind(std::__cxx11::string_const&,metaf::ReportMetadata_const&)::
                    pkWndRgx_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&appendPeakWind(std::__cxx11::string_const&,metaf::ReportMetadata_const&)
                           ::pkWndRgx_abi_cxx11_);
    }
  }
  match.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  match._M_begin._M_current = (char *)0x0;
  match.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  match.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  bVar2 = std::
          regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                    (group,&match,
                     &appendPeakWind(std::__cxx11::string_const&,metaf::ReportMetadata_const&)::
                      pkWndRgx_abi_cxx11_,0);
  AVar6 = GROUP_INVALIDATED;
  if (bVar2) {
    this->windType = PEAK_WIND;
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::str(&sStack_88,&match,1);
    oVar7 = Direction::fromDegreesString(&sStack_88);
    std::__cxx11::string::~string((string *)&sStack_88);
    if (((undefined1  [12])
         oVar7.super__Optional_base<metaf::Direction,_true,_true>._M_payload.
         super__Optional_payload_base<metaf::Direction> & (undefined1  [12])0x1) !=
        (undefined1  [12])0x0) {
      this->windDir =
           (Direction)
           oVar7.super__Optional_base<metaf::Direction,_true,_true>._M_payload.
           super__Optional_payload_base<metaf::Direction>._M_payload;
      std::__cxx11::
      match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::str(&sStack_88,&match,2);
      oVar8 = Speed::fromString(&sStack_88,KNOTS);
      std::__cxx11::string::~string((string *)&sStack_88);
      if ((oVar8.super__Optional_base<metaf::Speed,_true,_true>._M_payload.
           super__Optional_payload_base<metaf::Speed>._8_8_ >> 0x20 & 1) != 0) {
        (this->wSpeed).speedValue.super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int> =
             oVar8.super__Optional_base<metaf::Speed,_true,_true>._M_payload.
             super__Optional_payload_base<metaf::Speed>._M_payload._0_8_;
        (this->wSpeed).speedUnit =
             oVar8.super__Optional_base<metaf::Speed,_true,_true>._M_payload.
             super__Optional_payload_base<metaf::Speed>._M_payload._8_4_;
        if ((reportMetadata->reportTime).super__Optional_base<metaf::MetafTime,_true,_true>.
            _M_payload.super__Optional_payload_base<metaf::MetafTime>._M_engaged == false) {
          std::__cxx11::
          match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::str(&sStack_88,&match,3);
          sVar1 = sStack_88._M_string_length;
          std::__cxx11::string::~string((string *)&sStack_88);
          if (sVar1 == 0) goto LAB_00189337;
        }
        std::__cxx11::
        match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::str(&sStack_88,&match,3);
        if (sStack_88._M_string_length == 0) {
          uVar3 = (reportMetadata->reportTime).super__Optional_base<metaf::MetafTime,_true,_true>.
                  _M_payload.super__Optional_payload_base<metaf::MetafTime>._M_payload._M_value.
                  hourValue;
        }
        else {
          std::__cxx11::
          match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::str(&local_48,&match,3);
          uVar5 = std::__cxx11::stoul(&local_48,(size_t *)0x0,10);
          uVar3 = (uint)uVar5;
          std::__cxx11::string::~string((string *)&local_48);
        }
        std::__cxx11::string::~string((string *)&sStack_88);
        std::__cxx11::
        match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::str(&sStack_88,&match,4);
        uVar5 = std::__cxx11::stoul(&sStack_88,(size_t *)0x0,10);
        std::__cxx11::string::~string((string *)&sStack_88);
        *(undefined1 *)
         ((long)&(this->evTime).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
                 super__Optional_payload_base<metaf::MetafTime>._M_payload + 4) = 0;
        (this->evTime).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
        super__Optional_payload_base<metaf::MetafTime>._M_payload._M_value.hourValue = uVar3;
        (this->evTime).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
        super__Optional_payload_base<metaf::MetafTime>._M_payload._M_value.minuteValue = (uint)uVar5
        ;
        if ((this->evTime).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
            super__Optional_payload_base<metaf::MetafTime>._M_engaged == false) {
          (this->evTime).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
          super__Optional_payload_base<metaf::MetafTime>._M_engaged = true;
        }
        this->incompleteText = NONE;
        AVar6 = APPENDED;
      }
    }
  }
LAB_00189337:
  std::
  _Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~_Vector_base((_Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   *)&match);
  return AVar6;
}

Assistant:

AppendResult WindGroup::appendPeakWind(const std::string & group,
	const ReportMetadata & reportMetadata)
{

	static const std::regex pkWndRgx("(\\d\\d0)([1-9]?\\d\\d)/(\\d\\d)?(\\d\\d)");
	static const auto matchDir = 1, matchSpeed = 2;
	static const auto matchHour = 3, matchMinute = 4;

	std::smatch match;
	if (!std::regex_match(group, match, pkWndRgx)) return AppendResult::GROUP_INVALIDATED;

	windType = Type::PEAK_WIND;
	const auto dir = Direction::fromDegreesString(match.str(matchDir));
	if (!dir.has_value()) return AppendResult::GROUP_INVALIDATED;
	windDir = *dir;

	const auto speed =
		Speed::fromString(match.str(matchSpeed), Speed::Unit::KNOTS);
	if (!speed.has_value()) return AppendResult::GROUP_INVALIDATED;
	wSpeed = *speed;

	if (!reportMetadata.reportTime.has_value() && match.str(matchHour).empty()) {
		return AppendResult::GROUP_INVALIDATED;
	}
	const unsigned int hour = match.str(matchHour).empty() ?
		reportMetadata.reportTime->hour() : (unsigned int)stoul(match.str(matchHour));
	const unsigned int minute = (unsigned int)stoul(match.str(matchMinute));
	evTime = MetafTime(hour, minute);
	incompleteText = IncompleteText::NONE;

	return AppendResult::APPENDED;
}